

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalSubsumption.cpp
# Opt level: O0

bool __thiscall
Inferences::GlobalSubsumption::perform
          (GlobalSubsumption *this,Clause *cl,Clause **replacement,ClauseIterator *premises)

{
  MappingIterator<Lib::Stack<Kernel::Unit_*>::BottomFirstIterator,_Inferences::GlobalSubsumption::Unit2ClFn,_Kernel::Clause_*>
  it_00;
  int iVar1;
  Clause *pCVar2;
  undefined8 *in_RDX;
  Clause *in_RSI;
  bool bVar3;
  BottomFirstIterator it;
  Clause *newCl;
  Stack<Kernel::Unit_*> *in_stack_000000d8;
  Clause *in_stack_000000e0;
  GlobalSubsumption *in_stack_000000e8;
  size_t in_stack_ffffffffffffff58;
  Stack<Kernel::Unit_*> *in_stack_ffffffffffffff60;
  VirtualIterator<Kernel::Clause_*> *this_00;
  undefined1 local_70 [8];
  VirtualIterator<Kernel::Clause_*> *pVStack_68;
  VirtualIterator<Kernel::Clause_*> *local_60;
  VirtualIterator<Kernel::Clause_*> local_58;
  BottomFirstIterator local_50;
  BottomFirstIterator in_stack_ffffffffffffffc8;
  
  if ((perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)::prems ==
       '\0') &&
     (iVar1 = __cxa_guard_acquire(&perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)
                                   ::prems), iVar1 != 0)) {
    Lib::Stack<Kernel::Unit_*>::Stack(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    __cxa_atexit(Lib::Stack<Kernel::Unit_*>::~Stack,&perform::prems,&__dso_handle);
    __cxa_guard_release(&perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)
                         ::prems);
  }
  pCVar2 = perform(in_stack_000000e8,in_stack_000000e0,in_stack_000000d8);
  bVar3 = pCVar2 != in_RSI;
  if (bVar3) {
    Lib::Stack<Kernel::Unit_*>::BottomFirstIterator::BottomFirstIterator(&local_50,&perform::prems);
    *in_RDX = pCVar2;
    Lib::
    getMappingIterator<Lib::Stack<Kernel::Unit*>::BottomFirstIterator,Inferences::GlobalSubsumption::Unit2ClFn>
              (local_70,CONCAT44(local_50._pointer._4_4_,local_50._pointer._0_4_),
               CONCAT44(local_50._afterLast._4_4_,local_50._afterLast._0_4_));
    this_00 = &local_58;
    it_00._inner = in_stack_ffffffffffffffc8;
    it_00._0_8_ = pCVar2;
    Lib::
    pvi<Lib::MappingIterator<Lib::Stack<Kernel::Unit*>::BottomFirstIterator,Inferences::GlobalSubsumption::Unit2ClFn,Kernel::Clause*>>
              (it_00);
    Lib::VirtualIterator<Kernel::Clause_*>::operator=(this_00,local_60);
    Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator(pVStack_68);
  }
  return bVar3;
}

Assistant:

bool GlobalSubsumption::perform(Clause* cl, Clause*& replacement, ClauseIterator& premises)
{
  static Stack<Unit*> prems;

  Clause* newCl = perform(cl,prems);
  if(newCl==cl) {
    return false;
  }

  Stack<Unit*>::BottomFirstIterator it(prems);

  replacement = newCl;
  premises = pvi( getMappingIterator(it, Unit2ClFn()) );
  return true;
}